

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::UnpackedStructType::UnpackedStructType
          (UnpackedStructType *this,Compilation *compilation,SourceLocation loc,ASTContext *context)

{
  string_view name;
  int iVar1;
  SourceLocation in_RCX;
  Compilation *in_RDX;
  Compilation *in_RSI;
  Symbol *in_RDI;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  SymbolKind in_stack_ffffffffffffffd4;
  Type *in_stack_ffffffffffffffd8;
  Symbol *pSVar2;
  
  pSVar2 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  name._M_str = (char *)pSVar2;
  name._M_len = (size_t)in_RSI;
  Type::Type(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,name,in_RCX);
  Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDX,in_RDI)
  ;
  std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)0x551352);
  in_RDI[2].name._M_str = (char *)0x0;
  in_RDI[2].location = (SourceLocation)0x0;
  iVar1 = Compilation::getNextStructSystemId(in_RSI);
  *(int *)&in_RDI[2].parentScope = iVar1;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x55138e);
  Symbol::setParent((Symbol *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (Scope *)in_RDX,(SymbolIndex)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

UnpackedStructType::UnpackedStructType(Compilation& compilation, SourceLocation loc,
                                       const ASTContext& context) :
    Type(SymbolKind::UnpackedStructType, "", loc), Scope(compilation, this),
    systemId(compilation.getNextStructSystemId()) {

    // Struct types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}